

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caller.hpp
# Opt level: O3

PyObject * __thiscall
boost::python::detail::caller_arity<1U>::
impl<std::vector<HighFreqDataType,_std::allocator<HighFreqDataType>_>_(MlmWrap::*)(),_boost::python::default_call_policies,_boost::mpl::vector2<std::vector<HighFreqDataType,_std::allocator<HighFreqDataType>_>,_AbstractModuleClient_&>_>
::operator()(impl<std::vector<HighFreqDataType,_std::allocator<HighFreqDataType>_>_(MlmWrap::*)(),_boost::python::default_call_policies,_boost::mpl::vector2<std::vector<HighFreqDataType,_std::allocator<HighFreqDataType>_>,_AbstractModuleClient_&>_>
             *this,PyObject *args_,PyObject *param_2)

{
  long lVar1;
  long *plVar2;
  PyObject *pPVar3;
  code *pcVar4;
  vector<HighFreqDataType,_std::allocator<HighFreqDataType>_> local_20;
  
  lVar1 = converter::get_lvalue_from_python
                    ((_object *)args_[1].ob_type,
                     converter::detail::registered_base<AbstractModuleClient_const_volatile&>::
                     converters);
  if (lVar1 == 0) {
    pPVar3 = (PyObject *)0x0;
  }
  else {
    pcVar4 = (code *)(this->m_data).
                     super_compressed_pair_imp<std::vector<HighFreqDataType,_std::allocator<HighFreqDataType>_>_(MlmWrap::*)(),_boost::python::default_call_policies,_2>
                     .first_;
    plVar2 = (long *)(lVar1 + *(long *)&(this->m_data).
                                        super_compressed_pair_imp<std::vector<HighFreqDataType,_std::allocator<HighFreqDataType>_>_(MlmWrap::*)(),_boost::python::default_call_policies,_2>
                                        .field_0x8);
    if (((ulong)pcVar4 & 1) != 0) {
      pcVar4 = *(code **)(pcVar4 + *plVar2 + -1);
    }
    (*pcVar4)(&local_20,plVar2);
    pPVar3 = (PyObject *)
             converter::registration::to_python
                       (converter::detail::
                        registered_base<std::vector<HighFreqDataType,std::allocator<HighFreqDataType>>const_volatile&>
                        ::converters,&local_20);
    std::vector<HighFreqDataType,_std::allocator<HighFreqDataType>_>::~vector(&local_20);
  }
  return pPVar3;
}

Assistant:

PyObject* operator()(PyObject* args_, PyObject*) // eliminate
                                                         // this
                                                         // trailing
                                                         // keyword dict
        {
            typedef typename mpl::begin<Sig>::type first;
            typedef typename first::type result_t;
            typedef typename select_result_converter<Policies, result_t>::type result_converter;
            typedef typename Policies::argument_package argument_package;
            
            argument_package inner_args(args_);

# if N
#  define BOOST_PP_LOCAL_MACRO(i) BOOST_PYTHON_ARG_CONVERTER(i)
#  define BOOST_PP_LOCAL_LIMITS (0, N-1)
#  include BOOST_PP_LOCAL_ITERATE()
# endif 
            // all converters have been checked. Now we can do the
            // precall part of the policy
            if (!m_data.second().precall(inner_args))
                return 0;

            PyObject* result = detail::invoke(
                detail::invoke_tag<result_t,F>()
              , create_result_converter(args_, (result_converter*)0, (result_converter*)0)
              , m_data.first()
                BOOST_PP_ENUM_TRAILING_PARAMS(N, c)
            );
            
            return m_data.second().postcall(inner_args, result);
        }